

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

vector<duckdb::MetaBlockPointer,_true> * __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<duckdb::MetaBlockPointer,true>>
          (vector<duckdb::MetaBlockPointer,_true> *__return_storage_ptr__,Deserializer *this,
          field_id_t field_id,char *tag)

{
  undefined6 in_register_00000012;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000012,field_id) & 0xffffffff,tag);
  Read<duckdb::vector<duckdb::MetaBlockPointer,true>>(__return_storage_ptr__,this);
  (*this->_vptr_Deserializer[3])(this);
  return __return_storage_ptr__;
}

Assistant:

inline T ReadProperty(const field_id_t field_id, const char *tag) {
		OnPropertyBegin(field_id, tag);
		auto ret = Read<T>();
		OnPropertyEnd();
		return ret;
	}